

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void resume(lua_State *L,void *ud)

{
  int iVar1;
  CallInfo *ci;
  int *piVar2;
  int iVar3;
  StkId firstResult;
  
  iVar3 = *ud;
  firstResult = L->top + -(long)iVar3;
  if (L->status == '\x01') {
    ci = L->ci;
    L->status = '\0';
    ci->func = (StkId)((long)&L->stack->value_ + ci->extra);
    if ((ci->callstatus & 2) == 0) {
      if ((ci->u).l.base != (StkId)0x0) {
        piVar2 = *(int **)&L[-1].hookmask;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 != 0) {
          __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x2e9,"void resume(lua_State *, void *)");
        }
        iVar3 = (*(ci->u).c.k)(L,1,(ci->u).c.ctx);
        iVar1 = **(int **)&L[-1].hookmask;
        **(int **)&L[-1].hookmask = iVar1 + 1;
        if (iVar1 != 0) {
          __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x2eb,"void resume(lua_State *, void *)");
        }
        if ((long)L->top - (long)L->ci->func >> 4 <= (long)iVar3) {
          __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                        ,0x2ec,"void resume(lua_State *, void *)");
        }
        firstResult = L->top + -(long)iVar3;
      }
      luaD_poscall(L,ci,firstResult,iVar3);
    }
    else {
      luaV_execute(L);
    }
    unroll(L,(void *)0x0);
    return;
  }
  if (L->status != '\0') {
    __assert_fail("L->status == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x2e2,"void resume(lua_State *, void *)");
  }
  iVar3 = luaD_precall(L,firstResult + -1,-1,0);
  if (iVar3 != 0) {
    return;
  }
  luaV_execute(L);
  return;
}

Assistant:

static void resume (lua_State *L, void *ud) {
  int n = *(cast(int*, ud));  /* number of arguments */
  StkId firstArg = L->top - n;  /* first argument */
  CallInfo *ci = L->ci;
  if (L->status == LUA_OK) {  /* starting a coroutine? */
    if (!luaD_precall(L, firstArg - 1, LUA_MULTRET, 0))  /* Lua function? */
      luaV_execute(L);  /* call it */
  }
  else {  /* resuming from previous yield */
    lua_assert(L->status == LUA_YIELD);
    L->status = LUA_OK;  /* mark that it is running (again) */
    ci->func = restorestack(L, ci->extra);
    if (isLua(ci))  /* yielded inside a hook? */
      luaV_execute(L);  /* just continue running Lua code */
    else {  /* 'common' yield */
      if (ci->u.c.k != NULL) {  /* does it have a continuation function? */
        lua_unlock(L);
        n = (*ci->u.c.k)(L, LUA_YIELD, ci->u.c.ctx); /* call continuation */
        lua_lock(L);
        api_checknelems(L, n);
        firstArg = L->top - n;  /* yield results come from continuation */
      }
      luaD_poscall(L, ci, firstArg, n);  /* finish 'luaD_precall' */
    }
    unroll(L, NULL);  /* run continuation */
  }
}